

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall
CTPNCall::gen_code_new
          (CTPNCall *this,int discard,int argc,int varargs,CTcNamedArgs *named_args,int from_call,
          int is_transient)

{
  CTcPrsNode *pCVar1;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  CTcNamedArgs *named_args_00;
  int varargs_local;
  CTcNamedArgs my_named_args;
  
  varargs_local = varargs;
  if (from_call != 0) {
    CTcTokenizer::log_error
              (0x2cf8,CONCAT44(in_register_00000034,discard),CONCAT44(in_register_00000014,argc));
    return;
  }
  named_args_00 = &my_named_args;
  if (named_args != (CTcNamedArgs *)0x0) {
    named_args_00 = named_args;
  }
  CTPNArglist::gen_code_arglist((this->super_CTPNCallBase).arglist_,&varargs_local,named_args_00);
  pCVar1 = (this->super_CTPNCallBase).func_;
  (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x16])
            (pCVar1,discard,
             (ulong)(uint)(((this->super_CTPNCallBase).arglist_)->super_CTPNArglistBase).argc_,
             (ulong)(uint)varargs_local,named_args_00,1,is_transient);
  return;
}

Assistant:

void CTPNCall::gen_code_new(int discard, int argc, int varargs,
                            CTcNamedArgs *named_args,
                            int from_call, int is_transient)
{
    /* 
     *   if this is a recursive call from another 'call' node, it's not
     *   allowed - we'd be trying to use the result of a call as the base
     *   class of the 'new', which is illegal 
     */
    if (from_call)
    {
        G_tok->log_error(TCERR_INVAL_NEW_EXPR);
        return;
    }

    /* use our own named_args structure if the caller didn't provide one */
    CTcNamedArgs my_named_args;
    if (named_args == 0)
        named_args = &my_named_args;
    
    /* generate the argument list */
    get_arg_list()->gen_code_arglist(&varargs, *named_args);

    /* generate the code for the 'new' call */
    get_func()->gen_code_new(discard, get_arg_list()->get_argc(),
                             varargs, named_args, TRUE, is_transient);
}